

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes LookToRead_Look_Lookahead(void *pp,void **buf,size_t *size)

{
  ulong local_38;
  size_t size2;
  CLookToRead *p;
  size_t *psStack_20;
  SRes res;
  size_t *size_local;
  void **buf_local;
  void *pp_local;
  
  p._4_4_ = 0;
  local_38 = *(long *)((long)pp + 0x30) - *(long *)((long)pp + 0x28);
  size2 = (size_t)pp;
  psStack_20 = size;
  size_local = (size_t *)buf;
  if ((local_38 == 0) && (*size != 0)) {
    *(undefined8 *)((long)pp + 0x28) = 0;
    local_38 = 0x4000;
    buf_local = (void **)pp;
    p._4_4_ = (*(code *)**(undefined8 **)((long)pp + 0x20))
                        (*(undefined8 *)((long)pp + 0x20),(long)pp + 0x38,&local_38);
    *(ulong *)(size2 + 0x30) = local_38;
  }
  if (local_38 < *psStack_20) {
    *psStack_20 = local_38;
  }
  *size_local = size2 + 0x38 + *(long *)(size2 + 0x28);
  return p._4_4_;
}

Assistant:

static SRes LookToRead_Look_Lookahead(void *pp, const void **buf, size_t *size)
{
  SRes res = SZ_OK;
  CLookToRead *p = (CLookToRead *)pp;
  size_t size2 = p->size - p->pos;
  if (size2 == 0 && *size > 0)
  {
    p->pos = 0;
    size2 = LookToRead_BUF_SIZE;
    res = p->realStream->Read(p->realStream, p->buf, &size2);
    p->size = size2;
  }
  if (size2 < *size)
    *size = size2;
  *buf = p->buf + p->pos;
  return res;
}